

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

bool doctest::anon_unknown_15::parseCommaSepArgs
               (int argc,char **argv,char *pattern,
               vector<doctest::String,_std::allocator<doctest::String>_> *res)

{
  char cVar1;
  bool bVar2;
  undefined1 extraout_AL;
  size_t sVar3;
  String *value;
  char cVar4;
  size_t sVar5;
  anon_class_16_2_fa5d9a36 flush;
  String filtersString;
  ostringstream s;
  
  value = &filtersString;
  filtersString.field_0.buf[0] = '\0';
  filtersString.field_0.buf[0x17] = '\x17';
  s = (ostringstream)0x0;
  bVar2 = parseOption(argc,argv,pattern,value,(String *)&s);
  String::~String((String *)&s);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
    if (filtersString.field_0.buf[0x17] < '\0') {
      value = (String *)CONCAT71(filtersString.field_0._1_7_,filtersString.field_0.buf[0]);
    }
    flush.s = &s;
    flush.res = res;
    sVar3 = strlen((char *)value);
    bVar2 = false;
    for (sVar5 = 0; sVar3 != sVar5; sVar5 = sVar5 + 1) {
      cVar1 = (value->field_0).buf[sVar5];
      cVar4 = (char)&s;
      if (bVar2) {
        if ((cVar1 != '\\') && (cVar1 != ',')) {
          std::ostream::put(cVar4);
          bVar2 = false;
          goto LAB_00108d75;
        }
        std::ostream::put(cVar4);
        bVar2 = false;
      }
      else {
LAB_00108d75:
        if (cVar1 == '\\') {
          bVar2 = true;
        }
        else if (cVar1 == ',') {
          parseCommaSepArgs::anon_class_16_2_fa5d9a36::operator()(&flush);
        }
        else {
          std::ostream::put(cVar4);
        }
      }
    }
    if (bVar2) {
      std::ostream::put((char)&s);
    }
    parseCommaSepArgs::anon_class_16_2_fa5d9a36::operator()(&flush);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
  }
  String::~String(&filtersString);
  return (bool)extraout_AL;
}

Assistant:

bool parseCommaSepArgs(int argc, const char* const* argv, const char* pattern,
                           std::vector<String>& res) {
        String filtersString;
        if(parseOption(argc, argv, pattern, &filtersString)) {
            // tokenize with "," as a separator, unless escaped with backslash
            std::ostringstream s;
            auto flush = [&s, &res]() {
                auto string = s.str();
                if(string.size() > 0) {
                    res.push_back(string.c_str());
                }
                s.str("");
            };

            bool seenBackslash = false;
            const char* current = filtersString.c_str();
            const char* end = current + strlen(current);
            while(current != end) {
                char character = *current++;
                if(seenBackslash) {
                    seenBackslash = false;
                    if(character == ',' || character == '\\') {
                        s.put(character);
                        continue;
                    }
                    s.put('\\');
                }
                if(character == '\\') {
                    seenBackslash = true;
                } else if(character == ',') {
                    flush();
                } else {
                    s.put(character);
                }
            }

            if(seenBackslash) {
                s.put('\\');
            }
            flush();
            return true;
        }
        return false;
    }